

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::emit_wave_multi_prefix_count_bits_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Builder *pBVar2;
  Operation *this;
  Value *pVVar3;
  Operation *op;
  uint i;
  long lVar4;
  Id ballot [4];
  
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = SPIRVModule::get_helper_call_id(impl->spirv_module,WaveMultiPrefixCountBits,0);
  this = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction);
  Operation::add_id(this,IVar1);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  Operation::add_id(this,IVar1);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)lVar4 + 2);
    IVar1 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
    ballot[lVar4] = IVar1;
  }
  IVar1 = spv::Builder::makeUintType(pBVar2,0x20);
  IVar1 = Converter::Impl::build_vector(impl,IVar1,ballot,4);
  Operation::add_id(this,IVar1);
  if (((((impl->options).nv_subgroup_partition_enabled == false) &&
       (impl->execution_model == ExecutionModelFragment)) &&
      ((impl->options).strict_helper_lane_waveops == true)) &&
     (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
    pBVar2 = Converter::Impl::builder(impl);
    IVar1 = spv::Builder::makeBoolType(pBVar2);
    op = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar1);
    Converter::Impl::add(impl,op,false);
    Operation::add_id(this,op->id);
  }
  Converter::Impl::add(impl,this,false);
  return true;
}

Assistant:

bool emit_wave_multi_prefix_count_bits_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// There is no NV equivalent for this one.

	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::WaveMultiPrefixCountBits);
	auto *op = impl.allocate(spv::OpFunctionCall, instruction);
	op->add_id(call_id);

	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	spv::Id ballot[4];
	for (unsigned i = 0; i < 4; i++)
		ballot[i] = impl.get_id_for_value(instruction->getOperand(2 + i));
	op->add_id(impl.build_vector(builder.makeUintType(32), ballot, 4));

	if (!impl.options.nv_subgroup_partition_enabled &&
	    wave_op_needs_helper_lane_masking(impl))
	{
		auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
		impl.add(is_helper_lane);
		op->add_id(is_helper_lane->id);
	}

	impl.add(op);

	return true;
}